

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O3

int ctemplate_htmlparser::jsparser_parse(jsparser_ctx *ctx,char *str,int size)

{
  uint uVar1;
  
  uVar1 = statemachine_parse(ctx->statemachine,str,size);
  if (0xf < (int)uVar1) {
    __assert_fail("state < JSPARSER_NUM_STATES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x7d,"int ctemplate_htmlparser::state_external(int)");
  }
  if (-1 < (int)uVar1) {
    return *(int *)(jsparser_states_external + (ulong)uVar1 * 4);
  }
  __assert_fail("state >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                ,0x7e,"int ctemplate_htmlparser::state_external(int)");
}

Assistant:

int jsparser_parse(jsparser_ctx *ctx, const char *str, int size)
{
    int internal_state;
    internal_state = statemachine_parse(ctx->statemachine, str, size);
    return state_external(internal_state);
}